

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O1

REF_STATUS ref_face_add_uniquely(REF_FACE ref_face,REF_INT *nodes)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  REF_INT *pRVar4;
  long lVar5;
  int iVar6;
  REF_STATUS ref_private_macro_code_rss;
  long lVar7;
  REF_INT face;
  REF_INT local_34;
  
  uVar3 = ref_face_with(ref_face,nodes,&local_34);
  if (uVar3 != 0) {
    if (uVar3 == 5) {
      iVar2 = ref_face->max;
      if (iVar2 <= ref_face->n) {
        iVar6 = 5000;
        if (5000 < (int)((double)iVar2 * 1.5)) {
          iVar6 = (int)((double)iVar2 * 1.5);
        }
        ref_face->max = iVar6 + iVar2;
        fflush(_stdout);
        if (0 < ref_face->max) {
          pRVar4 = (REF_INT *)realloc(ref_face->f2n,(ulong)(uint)(ref_face->max << 2) << 2);
          ref_face->f2n = pRVar4;
        }
        if (ref_face->f2n == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",
                 0xbc,"ref_face_add_uniquely","realloc ref_face->f2n NULL");
          uVar1 = (long)ref_face->max * 4;
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar1 & 0xffffffff,uVar1
                 ,4,(long)ref_face->max << 4);
          return 2;
        }
      }
      iVar2 = ref_face->n;
      lVar7 = (long)iVar2;
      ref_face->n = iVar2 + 1;
      pRVar4 = ref_face->f2n;
      lVar5 = 0;
      do {
        pRVar4[lVar7 * 4 + lVar5] = nodes[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      lVar5 = 0;
      do {
        uVar3 = ref_adj_add(ref_face->adj,ref_face->f2n[lVar7 * 4 + lVar5],iVar2);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",
                 200,"ref_face_add_uniquely",(ulong)uVar3,"reg face node");
          return uVar3;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      iVar6 = ref_face->f2n[(int)((uint)(lVar7 << 2) | 3)];
      if ((ref_face->f2n[lVar7 * 4] == iVar6) ||
         (uVar3 = ref_adj_add(ref_face->adj,iVar6,iVar2), uVar3 == 0)) {
        uVar3 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0xcd
               ,"ref_face_add_uniquely",(ulong)uVar3,"reg face node");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0xb6,
             "ref_face_add_uniquely",(ulong)uVar3,"looking for face");
    }
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_face_add_uniquely(REF_FACE ref_face, REF_INT *nodes) {
  REF_INT face, node;
  REF_STATUS status;

  status = ref_face_with(ref_face, nodes, &face);
  if (REF_SUCCESS == status) return REF_SUCCESS;
  if (REF_NOT_FOUND != status) RSS(status, "looking for face");

  if (ref_face_n(ref_face) >= ref_face_max(ref_face)) {
    REF_INT chunk;
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)ref_face_max(ref_face)));
    ref_face_max(ref_face) += chunk;
    ref_realloc(ref_face->f2n, 4 * ref_face_max(ref_face), REF_INT);
  }

  face = ref_face_n(ref_face);
  ref_face_n(ref_face)++;

  for (node = 0; node < 4; node++)
    ref_face_f2n(ref_face, node, face) = nodes[node];

  for (node = 0; node < 3; node++)
    RSS(ref_adj_add(ref_face_adj(ref_face), ref_face_f2n(ref_face, node, face),
                    face),
        "reg face node");

  if (ref_face_f2n(ref_face, 0, face) != ref_face_f2n(ref_face, 3, face))
    RSS(ref_adj_add(ref_face_adj(ref_face), ref_face_f2n(ref_face, 3, face),
                    face),
        "reg face node");

  return REF_SUCCESS;
}